

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O1

bool __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::Consume::advance_head(Consume *this)

{
  atomic<density::detail::LfQueueControl_*> *paVar1;
  ulong uVar2;
  ControlBlock *pCVar3;
  uintptr_t uint_pointer;
  uintptr_t uint_pointer_1;
  ulong uVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  
  uVar2 = this->m_next_ptr;
  paVar1 = &this->m_queue->m_head;
  LOCK();
  bVar5 = this->m_control == (paVar1->_M_b)._M_p;
  if (bVar5) {
    (paVar1->_M_b)._M_p = (__pointer_type)(uVar2 & 0xfffffffffffffff0);
  }
  UNLOCK();
  if (bVar5) {
    if ((this->m_next_ptr & 4) != 0) {
      pCVar3 = this->m_control;
      basic_default_allocator<65536UL>::deallocate
                ((basic_default_allocator<65536UL> *)this->m_queue,(void *)pCVar3[2].m_next,
                 pCVar3[3].m_next,pCVar3[4].m_next,0);
    }
    uVar4 = (ulong)this->m_control ^ uVar2;
    if (((uVar2 & 0xfff0) == 0) == uVar4 < 0x10000) {
      density_tests::detail::assert_failed<>
                ("is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
                 ,0x163);
    }
    if ((this->m_control == (ControlBlock *)((ulong)this->m_control & 0xffffffffffff0000 | 0xffc0))
        == uVar4 < 0x10000) {
      density_tests::detail::assert_failed<>
                ("!ConstConditional(Base::s_needs_end_control) || is_same_page == (m_control != Base::get_end_control_block(m_control))"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
                 ,0x166);
    }
    if (0xffff < uVar4) {
      LOCK();
      this->m_control->m_next = 0;
      UNLOCK();
      pCVar3 = this->m_control;
      PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::__tls_init();
      PageAllocator<density::detail::SystemPageManager<65536UL>_>::
      deallocate_page<(density::detail::page_allocation_type)0>
                ((PageAllocator<density::detail::SystemPageManager<65536UL>_> *)
                 (*in_FS_OFFSET + -0xc0),pCVar3);
    }
  }
  return bVar5;
}

Assistant:

bool advance_head() const
                {
                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);

                    auto expected = m_control;
                    if (m_queue->m_head.compare_exchange_strong(
                          expected, next, mem_seq_cst, mem_relaxed))
                    {
                        if (m_next_ptr & LfQueue_External)
                        {
                            auto const external_block = static_cast<ExternalBlock *>(
                              address_add(m_control, Base::s_element_min_offset));
                            m_queue->ALLOCATOR_TYPE::deallocate(
                              external_block->m_block,
                              external_block->m_size,
                              external_block->m_alignment);
                        }

                        bool const is_same_page = Base::same_page(m_control, next);
                        DENSITY_ASSERT_INTERNAL(
                          is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment));
                        DENSITY_ASSERT_INTERNAL(
                          !ConstConditional(Base::s_needs_end_control) ||
                          is_same_page == (m_control != Base::get_end_control_block(m_control)));

                        static_assert(offsetof(ControlBlock, m_next) == 0, "");

                        if (is_same_page)
                        {
                            if (Base::s_deallocate_zeroed_pages)
                            {
                                raw_atomic_store(&m_control->m_next, uintptr_t(0), mem_release);

                                auto const memset_dest =
                                  const_cast<uintptr_t *>(&m_control->m_next) + 1;
                                auto const memset_size = address_diff(next, memset_dest);
                                DENSITY_ASSUME_ALIGNED(memset_dest, alignof(uintptr_t));
                                DENSITY_ASSUME_UINT_ALIGNED(memset_size, alignof(uintptr_t));
                                std::memset(memset_dest, 0, memset_size);
                            }
                        }
                        else
                        {
                            /** the member m_next is zeroed even if s_deallocate_zeroed_pages is false, and before
                                deallocating the page, to allow a safe-pinning to the other consumers.
                                That is, if a consumers pins a page that is pointed by a m_next, and if after the pin
                                the m_next is still not zeroed, it can be sure that the allocator will not reuse the
                                page, even if it gets deallocated. If the consumer does not read again the member m_next
                                after pinning, it can't be sure that the page is recycled between the read of m_next and 
                                the pin. */
                            raw_atomic_store(&m_control->m_next, uintptr_t(0), mem_release);

                            if (Base::s_deallocate_zeroed_pages)
                                m_queue->ALLOCATOR_TYPE::deallocate_page_zeroed(m_control);
                            else
                                m_queue->ALLOCATOR_TYPE::deallocate_page(m_control);
                        }
                        return true;
                    }
                    else
                    {
                        return false;
                    }
                }